

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O3

int SetPWMPololu(POLOLU *pPololu,int channel,int pw)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  ulong uVar6;
  uchar sendbuf [512];
  undefined1 local_238 [4];
  byte local_234;
  byte local_233;
  
  iVar2 = (int)((double)(pw + -0x5dc) * pPololu->CoefPWs[channel]);
  if (pPololu->bProportionalPWs[channel] == 0) {
    uVar3 = iVar2 + 0x5dc;
  }
  else {
    iVar4 = pPololu->MidPWs[channel];
    if (iVar2 < 0) {
      iVar2 = (int)((ulong)((long)((pPololu->MinPWs[channel] - iVar4) * iVar2) * -0x10624dd3) >>
                   0x20);
    }
    else {
      iVar2 = (int)((ulong)((long)((pPololu->MaxPWs[channel] - iVar4) * iVar2) * 0x10624dd3) >> 0x20
                   );
    }
    uVar3 = ((iVar2 >> 5) - (iVar2 >> 0x1f)) + iVar4;
  }
  uVar1 = pPololu->MaxPWs[channel];
  if ((int)uVar3 < pPololu->MaxPWs[channel]) {
    uVar1 = uVar3;
  }
  if ((int)uVar1 <= pPololu->MinPWs[channel]) {
    uVar1 = pPololu->MinPWs[channel];
  }
  iVar4 = uVar1 - pPololu->LastPWs[channel];
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  if (pPololu->ThresholdPWs[channel] <= iVar2) {
    uVar6 = 0;
    memset(local_238,0,0x200);
    local_238[0] = 0xaa;
    local_238[1] = (undefined1)pPololu->DeviceNumber;
    local_238[2] = 4;
    local_234 = (char)uVar1 * '\x04' & 0x7c;
    local_233 = (byte)(uVar1 >> 5) & 0x7f;
    iVar2 = (pPololu->RS232Port).DevType;
    local_238[3] = (char)channel;
    if (iVar2 - 1U < 4) {
      iVar2 = (pPololu->RS232Port).s;
      do {
        sVar5 = send(iVar2,local_238 + uVar6,(ulong)(6 - (int)uVar6),0);
        if ((int)sVar5 < 1) {
          return 1;
        }
        uVar3 = (int)uVar6 + (int)sVar5;
        uVar6 = (ulong)uVar3;
      } while ((int)uVar3 < 6);
    }
    else {
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = *(int *)&(pPololu->RS232Port).hDev;
      uVar6 = 0;
      do {
        sVar5 = write(iVar2,local_238 + uVar6,(ulong)(6 - (int)uVar6));
        if ((int)sVar5 < 1) {
          return 1;
        }
        uVar3 = (int)uVar6 + (int)sVar5;
        uVar6 = (ulong)uVar3;
      } while (uVar3 < 6);
    }
    if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_238,6,1,(FILE *)pPololu->pfSaveFile);
      fflush((FILE *)pPololu->pfSaveFile);
    }
    pPololu->LastPWs[channel] = uVar1;
  }
  return 0;
}

Assistant:

inline int SetPWMPololu(POLOLU* pPololu, int channel, int pw)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int target = 0;
	int sendbuflen = 0;

	if (pPololu->bProportionalPWs[channel])
	{
		pw = (int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
		if (pw >= 0)
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
		else
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
	}
	else
	{
		pw = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
	}

	pw = max(min(pw, pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
	//pw = max(min(pw, DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

	// The requested PWM is only applied if it is slightly different from the current value.
	if (abs(pw-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) return EXIT_SUCCESS;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
	sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
	sendbuf[2] = (unsigned char)(SET_TARGET_COMMAND_POLOLU & 0x7F);
	sendbuf[3] = (unsigned char)channel;
	target = pw*4;
	sendbuf[4] = (unsigned char)(target & 0x7F);
	sendbuf[5] = (unsigned char)((target >> 7) & 0x7F);
	sendbuflen = 6;

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Update last known value.
	pPololu->LastPWs[channel] = pw;

	return EXIT_SUCCESS;
}